

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O1

BigInt * __thiscall BigInt::operator-(BigInt *__return_storage_ptr__,BigInt *this,BigInt *that)

{
  pointer plVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  BigInt *res_3;
  long lVar5;
  longlong lVar6;
  ulong uVar7;
  long lVar8;
  BigInt res;
  BigInt res_1;
  BigInt local_68;
  BigInt local_48;
  
  if (this->sign == that->sign) {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_68.vector_value,&this->vector_value);
    local_68.sign = this->sign * this->sign;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_48.vector_value,&that->vector_value);
    local_48.sign = that->sign * that->sign;
    bVar3 = operator<(&local_68,&local_48);
    if (local_48.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.vector_value.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (bVar3) {
      operator-(&local_68,that,this);
      std::vector<long_long,_std::allocator<long_long>_>::vector
                (&__return_storage_ptr__->vector_value,&local_68.vector_value);
      __return_storage_ptr__->sign = -local_68.sign;
    }
    else {
      std::vector<long_long,_std::allocator<long_long>_>::vector
                (&local_68.vector_value,&this->vector_value);
      local_68.sign = this->sign;
      plVar1 = (that->vector_value).super__Vector_base<long_long,_std::allocator<long_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = (uint)((ulong)((long)(that->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)plVar1) >> 3);
      bVar3 = 0 < (int)uVar4;
      if (0 < (int)uVar4) {
        lVar5 = 0;
        uVar2 = 1;
        do {
          uVar7 = uVar2;
          if (bVar3) {
            lVar6 = plVar1[uVar7 - 1];
          }
          else {
            lVar6 = 0;
          }
          lVar8 = (lVar5 - lVar6) +
                  local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7 - 1];
          local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7 - 1] = lVar8;
          if (lVar8 < 0) {
            local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7 - 1] = base + lVar8;
          }
          lVar5 = lVar8 >> 0x3f;
          bVar3 = uVar7 < (uVar4 & 0x7fffffff);
          uVar2 = uVar7 + 1;
        } while ((lVar8 < 0) || (uVar7 < (uVar4 & 0x7fffffff)));
      }
      trim(__return_storage_ptr__,&local_68);
    }
  }
  else {
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_68.vector_value,&that->vector_value);
    local_68.sign = -that->sign;
    operator+(__return_storage_ptr__,this,&local_68);
  }
  if (local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator-(const BigInt &that) const { //! subtraction operator overloading
        if (sign == that.sign) {
            //! assuming this >= that to implement borrow
            if (abs() >= that.abs()) {
                BigInt res = *this;

                //! keep looping for all digits until exhausted considering the carry
                for (int i = 0, borrow = 0; i < (int) that.vector_value.size() || borrow; ++i) {
                    res.vector_value[i] -= borrow + (i < (int) that.vector_value.size() ? that.vector_value[i] : 0);

                    borrow = res.vector_value[i] < 0; //! if we have borrow this will be negative, borrow it from the next digit

                    if (borrow)
                        res.vector_value[i] += base; //! take the borrow we are guaranteed to find borrow  since a>=b
                }

                return res.trim();
            }
            //!-ve as common factor
            return -(that - *this); //! reorder
        }

        //! A-B have different signs represent them as addition
        return *this + (-that);
    }